

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::DielectricInterfaceBxDF::f
          (DielectricInterfaceBxDF *this,Vector3f wo,Vector3f wi,TransportMode mode)

{
  TrowbridgeReitzDistribution *this_00;
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  int iVar8;
  long in_FS_OFFSET;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  Float FVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar17 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  SampledSpectrum SVar38;
  Tuple3<pbrt::Vector3,_float> local_a8;
  Tuple3<pbrt::Vector3,_float> local_98;
  float local_8c;
  undefined1 local_88 [16];
  Tuple3<pbrt::Vector3,_float> local_78;
  undefined1 local_68 [16];
  float local_50;
  Float local_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  auVar35._4_60_ = wi._12_60_;
  auVar35._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  local_48 = auVar35._0_16_;
  auVar34._8_56_ = wi._8_56_;
  auVar34._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar31._4_60_ = wo._12_60_;
  auVar31._0_4_ = wo.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar20._8_56_ = wo._8_56_;
  auVar20._0_8_ = wo.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar17 = auVar31._0_16_;
  local_78._0_8_ = vmovlps_avx(auVar20._0_16_);
  local_98._0_8_ = vmovlps_avx(auVar34._0_16_);
  auVar10 = vminss_avx(ZEXT416((uint)(this->mfDistrib).alpha_y),
                       ZEXT416((uint)(this->mfDistrib).alpha_x));
  auVar11 = ZEXT816(0);
  if (auVar10._0_4_ < 0.001) goto LAB_003d4139;
  this_00 = &this->mfDistrib;
  local_98.z = auVar35._0_4_;
  local_78.z = auVar31._0_4_;
  if (auVar31._0_4_ * auVar35._0_4_ <= 0.0) {
    if ((auVar31._0_4_ == 0.0) && (!NAN(auVar31._0_4_))) goto LAB_003d4139;
    local_38._0_4_ = auVar31._0_4_ * auVar35._0_4_;
    if ((auVar35._0_4_ == 0.0) && (!NAN(auVar35._0_4_))) goto LAB_003d4139;
    uVar2 = vcmpss_avx512f(ZEXT816(0),auVar17,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    local_48._0_4_ = (uint)bVar3 * (int)this->eta + (uint)!bVar3 * (int)(1.0 / this->eta);
    local_48._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar10._0_4_ = local_98.x * (float)local_48._0_4_ + local_78.x;
    auVar10._4_4_ = local_98.y * (float)local_48._0_4_ + local_78.y;
    auVar10._8_4_ = (float)local_48._0_4_ * 0.0 + 0.0;
    auVar10._12_4_ = (float)local_48._0_4_ * 0.0 + 0.0;
    local_a8.z = (float)local_48._0_4_ * auVar35._0_4_ + auVar31._0_4_;
    local_a8._0_8_ = vmovlps_avx(auVar10);
    if ((f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg == '\0') &&
       (iVar8 = __cxa_guard_acquire(&f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)
                                     ::reg), iVar8 != 0)) {
      StatRegisterer::StatRegisterer
                ((StatRegisterer *)
                 &f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg,
                 const::{lambda(pbrt::StatsAccumulator&)#1}::StatsAccumulator__,(PixelAccumFunc)0x0)
      ;
      __cxa_guard_release(&f(pbrt::Vector3<float>,pbrt::Vector3<float>,pbrt::TransportMode)::reg);
    }
    *(long *)(in_FS_OFFSET + -0xe0) = *(long *)(in_FS_OFFSET + -0xe0) + 1;
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.y * local_a8.y)),ZEXT416((uint)local_a8.x),
                              ZEXT416((uint)local_a8.x));
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)local_a8.z),ZEXT416((uint)local_a8.z),auVar10);
    fVar9 = auVar10._0_4_;
    if ((fVar9 == 0.0) && (!NAN(fVar9))) {
      *(long *)(in_FS_OFFSET + -0xe8) = *(long *)(in_FS_OFFSET + -0xe8) + 1;
      auVar11 = ZEXT816(0) << 0x40;
      goto LAB_003d4139;
    }
    if (fVar9 < 0.0) {
      fVar9 = sqrtf(fVar9);
    }
    else {
      auVar10 = vsqrtss_avx(auVar10,auVar10);
      fVar9 = auVar10._0_4_;
    }
    auVar27._0_4_ = local_a8.z / fVar9;
    auVar27._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar33._8_8_ = 0;
    auVar33._0_4_ = local_a8.x;
    auVar33._4_4_ = local_a8.y;
    auVar16._4_4_ = fVar9;
    auVar16._0_4_ = fVar9;
    auVar16._8_4_ = fVar9;
    auVar16._12_4_ = fVar9;
    auVar10 = vdivps_avx(auVar33,auVar16);
    auVar11 = vmovshdup_avx(auVar10);
    auVar16 = ZEXT816(0) << 0x20;
    auVar11 = vfmadd213ss_fma(auVar11,auVar16,auVar27);
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ + (auVar27._0_4_ - auVar27._0_4_))),
                              auVar10,auVar16);
    auVar17 = auVar10;
    if (auVar11._0_4_ < 0.0) {
      auVar17._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
      auVar17._8_4_ = auVar10._8_4_ ^ 0x80000000;
      auVar17._12_4_ = auVar10._12_4_ ^ 0x80000000;
    }
    uVar2 = vcmpss_avx512f(auVar11,auVar16,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar12._0_4_ = (float)((uint)bVar3 * (int)-auVar27._0_4_ + (uint)!bVar3 * (int)auVar27._0_4_);
    auVar12._4_12_ = auVar27._4_12_;
    local_a8._0_8_ = vmovlps_avx(auVar17);
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.y * local_98.y)),ZEXT416((uint)local_a8.x),
                              ZEXT416((uint)local_98.x));
    auVar10 = vfmadd231ss_fma(auVar10,auVar12,ZEXT416((uint)local_98.z));
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.y * local_78.y)),ZEXT416((uint)local_a8.x),
                              ZEXT416((uint)local_78.x));
    auVar17 = vfmadd231ss_fma(auVar11,auVar12,ZEXT416((uint)local_78.z));
    auVar11 = ZEXT816(0);
    if (0.0 < auVar10._0_4_ * auVar17._0_4_) goto LAB_003d4139;
    bVar6 = auVar17._0_4_ < -1.0;
    auVar16 = SUB6416(ZEXT464(0x3f800000),0);
    auVar10 = vminss_avx(auVar16,auVar17);
    fVar9 = (float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar10._0_4_);
    bVar7 = 0.0 < fVar9;
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar10 = vandps_avx512vl(auVar17,auVar5);
    uVar2 = vcmpss_avx512f(auVar16,auVar17,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    local_68._4_12_ = auVar10._4_12_;
    auVar11 = ZEXT416((uint)bVar7 * (int)this->eta + (uint)!bVar7 * (int)(1.0 / this->eta));
    local_68._0_4_ =
         (uint)bVar7 * (int)fVar9 +
         (uint)!bVar7 *
         ((uint)bVar6 * 0x3f800000 +
         (uint)!bVar6 * ((uint)bVar3 * 0x3f800000 + (uint)!bVar3 * auVar10._0_4_));
    auVar10 = vfnmadd213ss_fma(local_68,local_68,auVar16);
    auVar10 = vmaxss_avx(auVar10,ZEXT816(0));
    local_a8.z = auVar12._0_4_;
    if (auVar10._0_4_ < 0.0) {
      local_88 = auVar11;
      auVar23._0_4_ = sqrtf(auVar10._0_4_);
      auVar23._4_60_ = extraout_var_01;
      auVar10 = auVar23._0_16_;
      auVar11 = local_88;
    }
    else {
      auVar10 = vsqrtss_avx(auVar10,auVar10);
    }
    auVar18._0_4_ = auVar10._0_4_ / auVar11._0_4_;
    auVar18._4_12_ = auVar10._4_12_;
    local_8c = 1.0;
    if (auVar18._0_4_ < 1.0) {
      auVar10 = vfnmadd213ss_fma(auVar18,auVar18,ZEXT416(0x3f800000));
      auVar29._0_12_ = ZEXT812(0);
      auVar29._12_4_ = 0;
      auVar10 = vmaxss_avx(auVar10,auVar29);
      if (auVar10._0_4_ < 0.0) {
        local_88 = auVar11;
        auVar24._0_4_ = sqrtf(auVar10._0_4_);
        auVar24._4_60_ = extraout_var_02;
        auVar10 = auVar24._0_16_;
        auVar11 = local_88;
      }
      else {
        auVar10 = vsqrtss_avx(auVar10,auVar10);
      }
      auVar16 = vfmsub213ss_fma(local_68,auVar11,auVar10);
      auVar17 = vfmadd213ss_fma(local_68,auVar11,auVar10);
      auVar30._0_4_ = auVar16._0_4_ / auVar17._0_4_;
      auVar30._4_12_ = auVar16._4_12_;
      auVar17 = vfnmadd213ss_fma(auVar10,auVar11,local_68);
      auVar10 = vfmadd213ss_fma(auVar10,auVar11,local_68);
      fVar9 = auVar17._0_4_ / auVar10._0_4_;
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar9)),auVar30,auVar30);
      local_8c = auVar10._0_4_ * 0.5;
    }
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.y * local_98.y)),ZEXT416((uint)local_a8.x),
                              ZEXT416((uint)local_98.x));
    auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)local_a8.z),ZEXT416((uint)local_98.z));
    local_88._0_4_ = auVar10._0_4_;
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.y * local_78.y)),ZEXT416((uint)local_a8.x),
                              ZEXT416((uint)local_78.x));
    auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)local_a8.z),ZEXT416((uint)local_78.z));
    local_68._0_4_ = auVar10._0_4_;
    local_4c = TrowbridgeReitzDistribution::D(this_00,(Vector3f *)&local_a8);
    local_50 = TrowbridgeReitzDistribution::Lambda(this_00,(Vector3f *)&local_78);
    FVar13 = TrowbridgeReitzDistribution::Lambda(this_00,(Vector3f *)&local_98);
    fVar9 = 1.0 / local_48._0_4_;
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.y * local_98.y)),ZEXT416((uint)local_a8.x),
                              ZEXT416((uint)local_98.x));
    auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)local_a8.z),ZEXT416((uint)local_98.z));
    auVar37._8_4_ = 0x7fffffff;
    auVar37._0_8_ = 0x7fffffff7fffffff;
    auVar37._12_4_ = 0x7fffffff;
    auVar10 = vandps_avx(auVar10,auVar37);
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(local_a8.y * local_78.y)),ZEXT416((uint)local_a8.x),
                              ZEXT416((uint)local_78.x));
    auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)local_a8.z),ZEXT416((uint)local_78.z));
    auVar11 = vandps_avx(auVar11,auVar37);
    auVar17 = vfmadd231ss_fma(ZEXT416((uint)local_68._0_4_),local_48,ZEXT416((uint)local_88._0_4_));
    auVar19._0_4_ =
         ((1.0 / (local_50 + 1.0 + FVar13)) * local_4c * auVar10._0_4_ * auVar11._0_4_) /
         (auVar17._0_4_ * auVar17._0_4_ * (float)local_38._0_4_);
    auVar19._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar10 = vandps_avx(auVar19,auVar37);
    fVar9 = (float)((uint)(mode == Radiance) * (int)(fVar9 * fVar9) +
                   (uint)(mode != Radiance) * 0x3f800000) * (1.0 - local_8c) * auVar10._0_4_;
  }
  else {
    auVar14._0_4_ = local_98.x + local_78.x;
    auVar14._4_4_ = local_98.y + local_78.y;
    auVar14._8_8_ = 0;
    local_a8.z = auVar31._0_4_ + auVar35._0_4_;
    uVar1 = vmovlps_avx(auVar14);
    auVar11 = ZEXT416(0) << 0x20;
    if (((auVar31._0_4_ == 0.0) && (!NAN(auVar31._0_4_))) ||
       ((auVar35._0_4_ == 0.0 && (!NAN(auVar35._0_4_))))) goto LAB_003d4139;
    local_a8.x = (float)uVar1;
    local_a8.y = (float)(uVar1 >> 0x20);
    if ((((local_a8.x == 0.0) && (local_a8.y == 0.0)) && (local_a8.z == 0.0)) && (!NAN(local_a8.z)))
    goto LAB_003d4139;
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)local_a8.x),ZEXT416((uint)local_a8.x),
                              ZEXT416((uint)(local_a8.y * local_a8.y)));
    auVar10 = vfmadd213ss_fma(ZEXT416((uint)local_a8.z),ZEXT416((uint)local_a8.z),auVar10);
    local_38 = auVar17;
    if (auVar10._0_4_ < 0.0) {
      local_a8._0_8_ = uVar1;
      fVar9 = sqrtf(auVar10._0_4_);
    }
    else {
      auVar10 = vsqrtss_avx(auVar10,auVar10);
      fVar9 = auVar10._0_4_;
      local_a8._0_8_ = uVar1;
    }
    auVar17 = ZEXT816(0) << 0x40;
    auVar32._8_4_ = 0x7fffffff;
    auVar32._0_8_ = 0x7fffffff7fffffff;
    auVar32._12_4_ = 0x7fffffff;
    auVar25._8_8_ = 0;
    auVar25._0_4_ = local_a8.x;
    auVar25._4_4_ = local_a8.y;
    auVar36._4_4_ = fVar9;
    auVar36._0_4_ = fVar9;
    auVar36._8_4_ = fVar9;
    auVar36._12_4_ = fVar9;
    auVar10 = vdivps_avx(auVar25,auVar36);
    local_a8.z = local_a8.z / fVar9;
    local_a8._0_8_ = vmovlps_avx(auVar10);
    auVar11 = vmovshdup_avx(auVar10);
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * 0.0)),auVar10,auVar17);
    fVar9 = local_a8.z + auVar11._0_4_;
    auVar26 = auVar10;
    if (fVar9 < 0.0) {
      auVar26._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
      auVar26._8_4_ = auVar10._8_4_ ^ 0x80000000;
      auVar26._12_4_ = auVar10._12_4_ ^ 0x80000000;
    }
    local_38 = vandps_avx(local_38,auVar32);
    local_48 = vandps_avx(local_48,auVar32);
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar9),auVar17,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    auVar10 = vmovshdup_avx(auVar26);
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ * local_98.y)),auVar26,
                              ZEXT416((uint)local_98.x));
    auVar11 = vfmadd231ss_fma(auVar10,ZEXT416((uint)bVar3 * (int)-local_a8.z +
                                              (uint)!bVar3 * (int)local_a8.z),
                              ZEXT416((uint)local_98.z));
    bVar6 = auVar11._0_4_ < -1.0;
    auVar16 = SUB6416(ZEXT464(0x3f800000),0);
    auVar10 = vminss_avx(auVar16,auVar11);
    fVar9 = (float)((uint)bVar6 * -0x40800000 + (uint)!bVar6 * auVar10._0_4_);
    bVar7 = 0.0 < fVar9;
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar10 = vandps_avx512vl(auVar11,auVar4);
    uVar2 = vcmpss_avx512f(auVar16,auVar11,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    local_68._4_12_ = auVar10._4_12_;
    auVar11 = ZEXT416((uint)bVar7 * (int)this->eta + (uint)!bVar7 * (int)(1.0 / this->eta));
    local_68._0_4_ =
         (uint)bVar7 * (int)fVar9 +
         (uint)!bVar7 *
         ((uint)bVar6 * 0x3f800000 +
         (uint)!bVar6 * ((uint)bVar3 * 0x3f800000 + (uint)!bVar3 * auVar10._0_4_));
    auVar10 = vfnmadd213ss_fma(local_68,local_68,auVar16);
    auVar10 = vmaxss_avx(auVar10,auVar17);
    if (auVar10._0_4_ < 0.0) {
      local_88 = auVar11;
      auVar21._0_4_ = sqrtf(auVar10._0_4_);
      auVar21._4_60_ = extraout_var;
      auVar10 = auVar21._0_16_;
      auVar11 = local_88;
    }
    else {
      auVar10 = vsqrtss_avx(auVar10,auVar10);
    }
    fVar9 = 1.0;
    auVar15._0_4_ = auVar10._0_4_ / auVar11._0_4_;
    auVar15._4_12_ = auVar10._4_12_;
    if (auVar15._0_4_ < 1.0) {
      auVar10 = vfnmadd213ss_fma(auVar15,auVar15,ZEXT416(0x3f800000));
      auVar10 = vmaxss_avx(auVar10,ZEXT816(0) << 0x40);
      if (auVar10._0_4_ < 0.0) {
        local_88 = auVar11;
        auVar22._0_4_ = sqrtf(auVar10._0_4_);
        auVar22._4_60_ = extraout_var_00;
        auVar10 = auVar22._0_16_;
        auVar11 = local_88;
      }
      else {
        auVar10 = vsqrtss_avx(auVar10,auVar10);
      }
      auVar16 = vfmsub213ss_fma(local_68,auVar11,auVar10);
      auVar17 = vfmadd213ss_fma(local_68,auVar11,auVar10);
      auVar28._0_4_ = auVar16._0_4_ / auVar17._0_4_;
      auVar28._4_12_ = auVar16._4_12_;
      auVar17 = vfnmadd213ss_fma(auVar10,auVar11,local_68);
      auVar10 = vfmadd213ss_fma(auVar10,auVar11,local_68);
      fVar9 = auVar17._0_4_ / auVar10._0_4_;
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar9)),auVar28,auVar28);
      fVar9 = auVar10._0_4_ * 0.5;
    }
    local_88._0_4_ = fVar9;
    FVar13 = TrowbridgeReitzDistribution::D(this_00,(Vector3f *)&local_a8);
    local_68._0_4_ = FVar13;
    local_8c = TrowbridgeReitzDistribution::Lambda(this_00,(Vector3f *)&local_78);
    FVar13 = TrowbridgeReitzDistribution::Lambda(this_00,(Vector3f *)&local_98);
    fVar9 = ((1.0 / (local_8c + 1.0 + FVar13)) * (float)local_68._0_4_ * (float)local_88._0_4_) /
            ((float)local_48._0_4_ * 4.0 * (float)local_38._0_4_);
  }
  auVar11._4_4_ = fVar9;
  auVar11._0_4_ = fVar9;
  auVar11._8_4_ = fVar9;
  auVar11._12_4_ = fVar9;
LAB_003d4139:
  auVar10 = vshufpd_avx(auVar11,auVar11,1);
  SVar38.values.values._0_8_ = auVar11._0_8_;
  SVar38.values.values._8_8_ = auVar10._0_8_;
  return (SampledSpectrum)SVar38.values.values;
}

Assistant:

f(Vector3f wo, Vector3f wi, TransportMode mode) const {
        if (mfDistrib.EffectivelySpecular())
            return SampledSpectrum(0);
        if (SameHemisphere(wo, wi)) {
            // Compute reflection at non-delta dielectric interface
            Float cosTheta_o = AbsCosTheta(wo), cosTheta_i = AbsCosTheta(wi);
            Vector3f wh = wi + wo;
            // Handle degenerate cases for microfacet reflection
            if (cosTheta_i == 0 || cosTheta_o == 0)
                return SampledSpectrum(0.);
            if (wh.x == 0 && wh.y == 0 && wh.z == 0)
                return SampledSpectrum(0.);
            wh = Normalize(wh);
            Float F = FrDielectric(Dot(wi, FaceForward(wh, Vector3f(0, 0, 1))), eta);
            return SampledSpectrum(mfDistrib.D(wh) * mfDistrib.G(wo, wi) * F /
                                   (4 * cosTheta_i * cosTheta_o));

        } else {
            // Compute transmission at non-delta dielectric interface
            Float cosTheta_o = CosTheta(wo), cosTheta_i = CosTheta(wi);
            if (cosTheta_i == 0 || cosTheta_o == 0)
                return {};
            // Compute $\wh$ from $\wo$ and $\wi$ for microfacet transmission
            Float etap = CosTheta(wo) > 0 ? eta : (1 / eta);
            Vector3f wh = wo + wi * etap;
            CHECK_RARE(1e-6, LengthSquared(wh) == 0);
            if (LengthSquared(wh) == 0)
                return {};
            wh = FaceForward(Normalize(wh), Normal3f(0, 0, 1));

            // both on same side?
            if (Dot(wi, wh) * Dot(wo, wh) > 0)
                return {};

            Float F = FrDielectric(Dot(wo, wh), eta);
            Float sqrtDenom = Dot(wo, wh) + etap * Dot(wi, wh);
            Float factor = (mode == TransportMode::Radiance) ? Sqr(1 / etap) : 1;
            return SampledSpectrum((1 - F) * factor *
                                   std::abs(mfDistrib.D(wh) * mfDistrib.G(wo, wi) *
                                            AbsDot(wi, wh) * AbsDot(wo, wh) /
                                            (cosTheta_i * cosTheta_o * Sqr(sqrtDenom))));
        }
    }